

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O2

void * zmq_socket(void *ctx_,int type_)

{
  bool bVar1;
  socket_base_t *psVar2;
  int *piVar3;
  
  if (ctx_ != (void *)0x0) {
    bVar1 = zmq::ctx_t::check_tag((ctx_t *)ctx_);
    if (bVar1) {
      psVar2 = zmq::ctx_t::create_socket((ctx_t *)ctx_,type_);
      return psVar2;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0xe;
  return (void *)0x0;
}

Assistant:

void *zmq_socket (void *ctx_, int type_)
{
    if (!ctx_ || !(static_cast<zmq::ctx_t *> (ctx_))->check_tag ()) {
        errno = EFAULT;
        return NULL;
    }
    zmq::ctx_t *ctx = static_cast<zmq::ctx_t *> (ctx_);
    zmq::socket_base_t *s = ctx->create_socket (type_);
    return static_cast<void *> (s);
}